

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_OFFReader_::read_ascii
          (_OFFReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt)

{
  Options *pOVar1;
  BaseImporter *pBVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  _Ios_Openmode _Var6;
  float *pfVar7;
  reference pvVar8;
  int *piVar9;
  ostream *poVar10;
  byte local_4f9;
  VectorT<unsigned_char,_4> local_4e0;
  undefined4 local_4dc;
  VectorT<unsigned_char,_3> local_4d7;
  undefined4 local_4d4;
  string local_4d0 [8];
  string trash_1;
  stringstream local_4b0 [8];
  stringstream stream_1;
  string local_320 [4];
  int colorType_1;
  string line_1;
  VertexHandle local_2fc;
  FaceHandle fh;
  BaseHandle local_2f4;
  BaseHandle local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  VectorT<unsigned_char,_4> local_2e0;
  int local_2dc;
  VectorT<unsigned_char,_3> local_2d7;
  int local_2d4;
  string local_2d0 [8];
  string trash;
  stringstream local_2b0 [8];
  stringstream stream;
  string local_120 [4];
  int colorType;
  string line;
  string local_f8 [8];
  string header;
  BaseHandle local_c4;
  undefined1 local_c0 [4];
  VertexHandle vh;
  VHandles vhandles;
  Vec4f c4f;
  undefined1 local_90 [8];
  Vec4i c4;
  Vec3f c3f;
  Vec3i c3;
  Vec2f t;
  Vec3f n;
  Vec3f v;
  uint dummy;
  uint nF;
  uint nV;
  uint idx;
  uint l;
  uint k;
  uint j;
  uint i;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  _OFFReader_ *this_local;
  
  _j = _opt;
  _opt_local = (Options *)_bi;
  _bi_local = (BaseImporter *)_in;
  _in_local = (istream *)this;
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1));
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)&t);
  VectorT<float,_2>::VectorT((VectorT<float,_2> *)(c3.super_VectorDataT<int,_3>.values_ + 1));
  VectorT<int,_3>::VectorT((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1));
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2));
  VectorT<int,_4>::VectorT((VectorT<int,_4> *)local_90);
  VectorT<float,_4>::VectorT
            ((VectorT<float,_4> *)
             &vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c0);
  VertexHandle::VertexHandle((VertexHandle *)&local_c4,-1);
  std::__cxx11::string::string(local_f8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)_bi_local,local_f8);
  std::istream::operator>>(_bi_local,&dummy);
  std::istream::operator>>(_bi_local,(uint *)(v.super_VectorDataT<float,_3>.values_ + 2));
  std::istream::operator>>(_bi_local,(uint *)(v.super_VectorDataT<float,_3>.values_ + 1));
  (**(code **)(*(long *)_opt_local + 0xd8))
            (_opt_local,dummy,dummy * 3,v.super_VectorDataT<float,_3>.values_[2]);
  k = 0;
  while( true ) {
    local_4f9 = 0;
    if (k < dummy) {
      local_4f9 = std::ios::eof();
      local_4f9 = local_4f9 ^ 0xff;
    }
    pBVar2 = _bi_local;
    if ((local_4f9 & 1) == 0) break;
    pfVar7 = VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),0);
    std::istream::operator>>(pBVar2,pfVar7);
    pBVar2 = _bi_local;
    pfVar7 = VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),1);
    std::istream::operator>>(pBVar2,pfVar7);
    pBVar2 = _bi_local;
    pfVar7 = VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),2);
    std::istream::operator>>(pBVar2,pfVar7);
    local_c4.idx_ =
         (**(code **)(*(long *)_opt_local + 0x10))
                   (_opt_local,n.super_VectorDataT<float,_3>.values_ + 1);
    bVar3 = Options::vertex_has_normal(&this->options_);
    pBVar2 = _bi_local;
    if (bVar3) {
      pfVar7 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,0);
      std::istream::operator>>(pBVar2,pfVar7);
      pBVar2 = _bi_local;
      pfVar7 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,1);
      std::istream::operator>>(pBVar2,pfVar7);
      pBVar2 = _bi_local;
      pfVar7 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,2);
      std::istream::operator>>(pBVar2,pfVar7);
      bVar3 = Options::vertex_has_normal(&this->userOptions_);
      if (bVar3) {
        (**(code **)(*(long *)_opt_local + 0x40))(_opt_local,local_c4.idx_,&t);
      }
    }
    std::__cxx11::string::string(local_120);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)_bi_local,local_120);
    bVar3 = Options::vertex_has_texcoord(&this->options_);
    iVar5 = getColorType(this,(string *)local_120,bVar3);
    _Var6 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_2b0,local_120,_Var6);
    bVar3 = Options::vertex_has_color(&this->options_);
    if (bVar3) {
      std::__cxx11::string::string(local_2d0);
      switch(iVar5) {
      case 0:
        break;
      case 1:
        std::operator>>((istream *)local_2b0,local_2d0);
        break;
      case 2:
        std::operator>>((istream *)local_2b0,local_2d0);
        std::operator>>((istream *)local_2b0,local_2d0);
        break;
      case 3:
        piVar9 = VectorT<int,_3>::operator[]
                           ((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1),0);
        std::istream::operator>>(local_2b0,piVar9);
        piVar9 = VectorT<int,_3>::operator[]
                           ((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1),1);
        std::istream::operator>>(local_2b0,piVar9);
        piVar9 = VectorT<int,_3>::operator[]
                           ((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1),2);
        std::istream::operator>>(local_2b0,piVar9);
        bVar3 = Options::vertex_has_color(&this->userOptions_);
        pOVar1 = _opt_local;
        if (bVar3) {
          local_2d4 = local_c4.idx_;
          VectorT<unsigned_char,_3>::VectorT<int>
                    (&local_2d7,(VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1));
          (**(code **)(*(long *)pOVar1 + 0x48))(pOVar1,local_2d4,&local_2d7);
        }
        break;
      case 4:
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,0);
        std::istream::operator>>(local_2b0,piVar9);
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,1);
        std::istream::operator>>(local_2b0,piVar9);
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,2);
        std::istream::operator>>(local_2b0,piVar9);
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,3);
        std::istream::operator>>(local_2b0,piVar9);
        bVar3 = Options::vertex_has_color(&this->userOptions_);
        pOVar1 = _opt_local;
        if (bVar3) {
          local_2dc = local_c4.idx_;
          VectorT<unsigned_char,_4>::VectorT<int>(&local_2e0,(VectorT<int,_4> *)local_90);
          (**(code **)(*(long *)pOVar1 + 0x50))(pOVar1,local_2dc,&local_2e0);
        }
        break;
      case 5:
        pfVar7 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2),0);
        std::istream::operator>>(local_2b0,pfVar7);
        pfVar7 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2),1);
        std::istream::operator>>(local_2b0,pfVar7);
        pfVar7 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2),2);
        std::istream::operator>>(local_2b0,pfVar7);
        bVar3 = Options::vertex_has_color(&this->userOptions_);
        if (bVar3) {
          local_2e4 = local_c4.idx_;
          (**(code **)(*(long *)_opt_local + 0x58))
                    (_opt_local,local_c4.idx_,c4.super_VectorDataT<int,_4>.values_ + 2);
          Options::operator+=(_j,0x1000);
        }
        break;
      case 6:
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        std::istream::operator>>(local_2b0,pfVar7);
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        std::istream::operator>>(local_2b0,pfVar7);
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
        std::istream::operator>>(local_2b0,pfVar7);
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
        std::istream::operator>>(local_2b0,pfVar7);
        bVar3 = Options::vertex_has_color(&this->userOptions_);
        if (bVar3) {
          local_2e8 = local_c4.idx_;
          (**(code **)(*(long *)_opt_local + 0x60))
                    (_opt_local,local_c4.idx_,
                     &vhandles.
                      super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Options::operator+=(_j,0x1000);
        }
        break;
      default:
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in file format (colorType = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
        std::operator<<(poVar10,")\n");
      }
      std::__cxx11::string::~string(local_2d0);
    }
    bVar3 = Options::vertex_has_texcoord(&this->options_);
    if (bVar3) {
      pfVar7 = VectorT<float,_2>::operator[]
                         ((VectorT<float,_2> *)(c3.super_VectorDataT<int,_3>.values_ + 1),0);
      std::istream::operator>>(local_2b0,pfVar7);
      pfVar7 = VectorT<float,_2>::operator[]
                         ((VectorT<float,_2> *)(c3.super_VectorDataT<int,_3>.values_ + 1),1);
      std::istream::operator>>(local_2b0,pfVar7);
      bVar3 = Options::vertex_has_texcoord(&this->userOptions_);
      if (bVar3) {
        local_2ec = local_c4.idx_;
        (**(code **)(*(long *)_opt_local + 0x68))
                  (_opt_local,local_c4.idx_,c3.super_VectorDataT<int,_3>.values_ + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_2b0);
    std::__cxx11::string::~string(local_120);
    k = k + 1;
  }
  for (k = 0; k < (uint)v.super_VectorDataT<float,_3>.values_[2]; k = k + 1) {
    std::istream::operator>>(_bi_local,&dummy);
    if (dummy == 3) {
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c0
                 ,3);
      std::istream::operator>>(_bi_local,&l);
      std::istream::operator>>(_bi_local,&idx);
      std::istream::operator>>(_bi_local,&nV);
      VertexHandle::VertexHandle((VertexHandle *)&local_2f0,l);
      pvVar8 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
               operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                          )local_c0,0);
      (pvVar8->super_BaseHandle).idx_ = local_2f0.idx_;
      VertexHandle::VertexHandle((VertexHandle *)&local_2f4,idx);
      pvVar8 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
               operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                          )local_c0,1);
      (pvVar8->super_BaseHandle).idx_ = local_2f4.idx_;
      VertexHandle::VertexHandle((VertexHandle *)&fh,nV);
      pvVar8 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
               operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                          )local_c0,2);
      (pvVar8->super_BaseHandle).idx_ = (int)fh.super_BaseHandle.idx_;
    }
    else {
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::clear
                ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c0
                );
      for (l = 0; l < dummy; l = l + 1) {
        std::istream::operator>>(_bi_local,&nF);
        VertexHandle::VertexHandle(&local_2fc,nF);
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::push_back
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   local_c0,&local_2fc);
      }
    }
    uVar4 = (**(code **)(*(long *)_opt_local + 0x20))(_opt_local,local_c0);
    bVar3 = Options::face_has_color(&this->options_);
    if (bVar3) {
      std::__cxx11::string::string(local_320);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)_bi_local,local_320)
      ;
      iVar5 = getColorType(this,(string *)local_320,false);
      _Var6 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_4b0,local_320,_Var6);
      std::__cxx11::string::string(local_4d0);
      switch(iVar5) {
      case 0:
        break;
      case 1:
        std::operator>>((istream *)local_4b0,local_4d0);
        break;
      case 2:
        std::operator>>((istream *)local_4b0,local_4d0);
        std::operator>>((istream *)local_4b0,local_4d0);
        break;
      case 3:
        piVar9 = VectorT<int,_3>::operator[]
                           ((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1),0);
        std::istream::operator>>(local_4b0,piVar9);
        piVar9 = VectorT<int,_3>::operator[]
                           ((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1),1);
        std::istream::operator>>(local_4b0,piVar9);
        piVar9 = VectorT<int,_3>::operator[]
                           ((VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1),2);
        std::istream::operator>>(local_4b0,piVar9);
        bVar3 = Options::face_has_color(&this->userOptions_);
        pOVar1 = _opt_local;
        if (bVar3) {
          local_4d4 = uVar4;
          VectorT<unsigned_char,_3>::VectorT<int>
                    (&local_4d7,(VectorT<int,_3> *)(c3f.super_VectorDataT<float,_3>.values_ + 1));
          (**(code **)(*(long *)pOVar1 + 0xa0))(pOVar1,local_4d4,&local_4d7);
        }
        break;
      case 4:
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,0);
        std::istream::operator>>(local_4b0,piVar9);
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,1);
        std::istream::operator>>(local_4b0,piVar9);
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,2);
        std::istream::operator>>(local_4b0,piVar9);
        piVar9 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)local_90,3);
        std::istream::operator>>(local_4b0,piVar9);
        bVar3 = Options::face_has_color(&this->userOptions_);
        pOVar1 = _opt_local;
        if (bVar3) {
          local_4dc = uVar4;
          VectorT<unsigned_char,_4>::VectorT<int>(&local_4e0,(VectorT<int,_4> *)local_90);
          (**(code **)(*(long *)pOVar1 + 0xa8))(pOVar1,local_4dc,&local_4e0);
        }
        break;
      case 5:
        pfVar7 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2),0);
        std::istream::operator>>(local_4b0,pfVar7);
        pfVar7 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2),1);
        std::istream::operator>>(local_4b0,pfVar7);
        pfVar7 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(c4.super_VectorDataT<int,_4>.values_ + 2),2);
        std::istream::operator>>(local_4b0,pfVar7);
        bVar3 = Options::face_has_color(&this->userOptions_);
        if (bVar3) {
          (**(code **)(*(long *)_opt_local + 0xb0))
                    (_opt_local,uVar4,c4.super_VectorDataT<int,_4>.values_ + 2);
          Options::operator+=(_j,0x1000);
        }
        break;
      case 6:
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        std::istream::operator>>(local_4b0,pfVar7);
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        std::istream::operator>>(local_4b0,pfVar7);
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
        std::istream::operator>>(local_4b0,pfVar7);
        pfVar7 = VectorT<float,_4>::operator[]
                           ((VectorT<float,_4> *)
                            &vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
        std::istream::operator>>(local_4b0,pfVar7);
        bVar3 = Options::face_has_color(&this->userOptions_);
        if (bVar3) {
          (**(code **)(*(long *)_opt_local + 0xb8))
                    (_opt_local,uVar4,
                     &vhandles.
                      super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Options::operator+=(_j,0x1000);
        }
        break;
      default:
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in file format (colorType = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
        std::operator<<(poVar10,")\n");
      }
      std::__cxx11::string::~string(local_4d0);
      std::__cxx11::stringstream::~stringstream(local_4b0);
      std::__cxx11::string::~string(local_320);
    }
  }
  std::__cxx11::string::~string(local_f8);
  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~vector
            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c0);
  return true;
}

Assistant:

bool
_OFFReader_::read_ascii(std::istream& _in, BaseImporter& _bi, Options& _opt) const
{


  unsigned int            i, j, k, l, idx;
  unsigned int            nV, nF, dummy;
  OpenMesh::Vec3f         v, n;
  OpenMesh::Vec2f         t;
  OpenMesh::Vec3i         c3;
  OpenMesh::Vec3f         c3f;
  OpenMesh::Vec4i         c4;
  OpenMesh::Vec4f         c4f;
  BaseImporter::VHandles  vhandles;
  VertexHandle            vh;

  // read header line
  std::string header;
  std::getline(_in,header);

  // + #Vertice, #Faces, #Edges
  _in >> nV;
  _in >> nF;
  _in >> dummy;

  _bi.reserve(nV, 3*nV, nF);

  // read vertices: coord [hcoord] [normal] [color] [texcoord]
  for (i=0; i<nV && !_in.eof(); ++i)
  {
    // Always read VERTEX
    _in >> v[0]; _in >> v[1]; _in >> v[2];

    vh = _bi.add_vertex(v);

    //perhaps read NORMAL
    if ( options_.vertex_has_normal() ){

      _in >> n[0]; _in >> n[1]; _in >> n[2];

      if ( userOptions_.vertex_has_normal() )
        _bi.set_normal(vh, n);
    }

    //take the rest of the line and check how colors are defined
    std::string line;
    std::getline(_in,line);

    int colorType = getColorType(line, options_.vertex_has_texcoord() );

    std::stringstream stream( line );

    //perhaps read COLOR
    if ( options_.vertex_has_color() ){

      std::string trash;

      switch (colorType){
        case 0 : break; //no color
        case 1 : stream >> trash; break; //one int (isn't handled atm)
        case 2 : stream >> trash; stream >> trash; break; //corrupt format (ignore)
        // rgb int
        case 3 : stream >> c3[0];  stream >> c3[1];  stream >> c3[2];
            if ( userOptions_.vertex_has_color() )
              _bi.set_color( vh, Vec3uc( c3 ) );
            break;
        // rgba int
        case 4 : stream >> c4[0];  stream >> c4[1];  stream >> c4[2]; stream >> c4[3];
            if ( userOptions_.vertex_has_color() )
              _bi.set_color( vh, Vec4uc( c4 ) );
            break;
        // rgb floats
        case 5 : stream >> c3f[0];  stream >> c3f[1];  stream >> c3f[2];
            if ( userOptions_.vertex_has_color() ) {
              _bi.set_color( vh, c3f );
              _opt += Options::ColorFloat;
            }
            break;
        // rgba floats
        case 6 : stream >> c4f[0];  stream >> c4f[1];  stream >> c4f[2]; stream >> c4f[3];
            if ( userOptions_.vertex_has_color() ) {
              _bi.set_color( vh, c4f );
              _opt += Options::ColorFloat;
            }
            break;

        default:
            std::cerr << "Error in file format (colorType = " << colorType << ")\n";
            break;
      }
    }
    //perhaps read TEXTURE COORDs
    if ( options_.vertex_has_texcoord() ){
      stream >> t[0]; stream >> t[1];
      if ( userOptions_.vertex_has_texcoord() )
        _bi.set_texcoord(vh, t);
    }
  }

  // faces
  // #N <v1> <v2> .. <v(n-1)> [color spec]
  for (i=0; i<nF; ++i)
  {
    // nV = number of Vertices for current face
    _in >> nV;

    if (nV == 3)
    {
      vhandles.resize(3);
      _in >> j;
      _in >> k;
      _in >> l;

      vhandles[0] = VertexHandle(j);
      vhandles[1] = VertexHandle(k);
      vhandles[2] = VertexHandle(l);
    }
    else
    {
      vhandles.clear();
      for (j=0; j<nV; ++j)
      {
         _in >> idx;
         vhandles.push_back(VertexHandle(idx));
      }
    }

    FaceHandle fh = _bi.add_face(vhandles);

    //perhaps read face COLOR
    if ( options_.face_has_color() ){

      //take the rest of the line and check how colors are defined
      std::string line;
      std::getline(_in,line);

      int colorType = getColorType(line, false );

      std::stringstream stream( line );

      std::string trash;

      switch (colorType){
        case 0 : break; //no color
        case 1 : stream >> trash; break; //one int (isn't handled atm)
        case 2 : stream >> trash; stream >> trash; break; //corrupt format (ignore)
        // rgb int
        case 3 : stream >> c3[0];  stream >> c3[1];  stream >> c3[2];
            if ( userOptions_.face_has_color() )
              _bi.set_color( fh, Vec3uc( c3 ) );
            break;
        // rgba int
        case 4 : stream >> c4[0];  stream >> c4[1];  stream >> c4[2]; stream >> c4[3];
            if ( userOptions_.face_has_color() )
              _bi.set_color( fh, Vec4uc( c4 ) );
            break;
        // rgb floats
        case 5 : stream >> c3f[0];  stream >> c3f[1];  stream >> c3f[2];
            if ( userOptions_.face_has_color() ) {
              _bi.set_color( fh, c3f );
              _opt += Options::ColorFloat;
            }
            break;
        // rgba floats
        case 6 : stream >> c4f[0];  stream >> c4f[1];  stream >> c4f[2]; stream >> c4f[3];
            if ( userOptions_.face_has_color() ) {
              _bi.set_color( fh, c4f );
              _opt += Options::ColorFloat;
            }
            break;

        default:
            std::cerr << "Error in file format (colorType = " << colorType << ")\n";
            break;
      }
    }
  }

  // File was successfully parsed.
  return true;
}